

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O2

bool __thiscall
llbuild::buildsystem::ShellCommand::configureAttribute
          (ShellCommand *this,ConfigureContext *ctx,StringRef name,ArrayRef<llvm::StringRef> values)

{
  pointer pSVar1;
  bool bVar2;
  undefined4 extraout_var;
  StringRef *From;
  size_type __n;
  long lVar3;
  Child local_80 [3];
  StringRef local_68;
  Twine local_58;
  Twine local_40;
  
  __n = values.Length;
  From = values.Data;
  if (name.Length == 4) {
    if (*(int *)name.Data == 0x73677261) {
      if (__n == 0) {
        local_68.Data = (this->super_ExternalCommand).super_Command.name._M_dataplus._M_p;
        local_68.Length = (this->super_ExternalCommand).super_Command.name._M_string_length;
        llvm::Twine::Twine(&local_40,"invalid arguments for command \'",&local_68);
        llvm::Twine::Twine(&local_58,"\'");
        llvm::Twine::concat((Twine *)local_80,&local_40,&local_58);
        ConfigureContext::error(ctx,(Twine *)local_80);
        return false;
      }
      pSVar1 = (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl
          .super__Vector_impl_data._M_finish != pSVar1) {
        (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
        super__Vector_impl_data._M_finish = pSVar1;
      }
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::reserve(&this->args,__n);
      for (lVar3 = __n << 4; lVar3 != 0; lVar3 = lVar3 + -0x10) {
        local_80[0]._0_4_ =
             (*ctx->delegate->_vptr_BuildFileDelegate[2])(ctx->delegate,From->Data,From->Length);
        local_80[0]._4_4_ = extraout_var;
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
        emplace_back<llvm::StringRef>(&this->args,(StringRef *)local_80);
        From = From + 1;
      }
    }
    else {
      if (*(int *)name.Data != 0x73706564) goto LAB_0014bd7d;
      llvm::
      SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::clear(&(this->depsPaths).
               super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             );
      llvm::SmallVectorImpl<std::__cxx11::string>::insert<llvm::StringRef_const*,void>
                ((SmallVectorImpl<std::__cxx11::string> *)&this->depsPaths,
                 (iterator)
                 (this->depsPaths).
                 super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .
                 super_SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 .
                 super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                 .super_SmallVectorBase.BeginX,From,From + __n);
    }
    return true;
  }
LAB_0014bd7d:
  bVar2 = ExternalCommand::configureAttribute(&this->super_ExternalCommand,ctx,name,values);
  return bVar2;
}

Assistant:

bool ShellCommand::configureAttribute(const ConfigureContext& ctx, StringRef name,
                                              ArrayRef<StringRef> values) {
  if (name == "args") {
    // Diagnose missing arguments.
    if (values.empty()) {
      ctx.error("invalid arguments for command '" + getName() + "'");
      return false;
    }

    args.clear();
    args.reserve(values.size());
    for (auto arg: values) {
      args.emplace_back(ctx.getDelegate().getInternedString(arg));
    }
  } else if (name == "deps") {
    depsPaths.clear();
    depsPaths.insert(depsPaths.begin(), values.begin(), values.end());
  } else {
    return ExternalCommand::configureAttribute(ctx, name, values);
  }

  return true;
}